

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall
cmSourceFile::cmSourceFile
          (cmSourceFile *this,cmMakefile *mf,string *name,cmSourceFileLocationKind kind)

{
  cmSourceFileLocationKind kind_local;
  string *name_local;
  cmMakefile *mf_local;
  cmSourceFile *this_local;
  
  cmSourceFileLocation::cmSourceFileLocation(&this->Location,mf,name,kind);
  cmPropertyMap::cmPropertyMap(&this->Properties);
  this->CustomCommand = (cmCustomCommand *)0x0;
  std::__cxx11::string::string((string *)&this->Extension);
  std::__cxx11::string::string((string *)&this->Language);
  std::__cxx11::string::string((string *)&this->FullPath);
  std::__cxx11::string::string((string *)&this->ObjectLibrary);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  this->FindFullPathFailed = false;
  this->IsGenerated = false;
  return;
}

Assistant:

cmSourceFile::cmSourceFile(cmMakefile* mf, const std::string& name,
                           cmSourceFileLocationKind kind)
  : Location(mf, name, kind)
{
}